

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgParameters.hpp
# Opt level: O0

void __thiscall rsg::ShaderParameters::ShaderParameters(ShaderParameters *this)

{
  ShaderParameters *this_local;
  
  this->randomize = false;
  this->maxStatementDepth = 2;
  this->maxStatementsPerBlock = 10;
  this->maxExpressionDepth = 5;
  this->maxCombinedVariableScalars = 0x20;
  this->maxUniformScalars = 0x200;
  this->maxInputVariables = 8;
  this->texLookupBaseWeight = 0.0;
  this->maxSamplers = 8;
  this->useTexture2D = false;
  this->useTextureCube = false;
  return;
}

Assistant:

ShaderParameters (void)
		: randomize						(false)
		, maxStatementDepth				(2)
		, maxStatementsPerBlock			(10)
		, maxExpressionDepth			(5)
		, maxCombinedVariableScalars	(32)
		, maxUniformScalars				(512)
		, maxInputVariables				(8)
		, texLookupBaseWeight			(0.0f)
		, maxSamplers					(8)
		, useTexture2D					(false)
		, useTextureCube				(false)
	{
	}